

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_anyNotEqual_uvec4(ShaderEvalContext *c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  int i;
  long lVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Vector<unsigned_int,_4> res_1;
  Vector<unsigned_int,_4> res;
  
  fVar3 = c->in[0].m_data[0];
  fVar4 = c->in[0].m_data[1];
  fVar5 = c->in[0].m_data[2];
  fVar6 = c->in[0].m_data[3];
  iVar10 = (int)fVar3;
  iVar12 = (int)fVar4;
  iVar14 = (int)fVar5;
  iVar16 = (int)fVar6;
  auVar18._0_4_ = iVar10 >> 0x1f;
  auVar18._4_4_ = iVar12 >> 0x1f;
  auVar18._8_4_ = iVar14 >> 0x1f;
  auVar18._12_4_ = iVar16 >> 0x1f;
  auVar1._4_4_ = (int)(fVar4 - 2.1474836e+09);
  auVar1._0_4_ = (int)(fVar3 - 2.1474836e+09);
  auVar1._8_4_ = (int)(fVar5 - 2.1474836e+09);
  auVar1._12_4_ = (int)(fVar6 - 2.1474836e+09);
  auVar19._4_4_ = iVar12;
  auVar19._0_4_ = iVar10;
  auVar19._8_4_ = iVar14;
  auVar19._12_4_ = iVar16;
  auVar19 = auVar18 & auVar1 | auVar19;
  auVar2 = auVar19._4_12_;
  res.m_data[0] = auVar2._0_4_;
  res.m_data[1] = auVar2._4_4_;
  res.m_data[2] = auVar2._8_4_;
  res.m_data[3] = auVar19._0_4_;
  fVar3 = c->in[1].m_data[0];
  fVar4 = c->in[1].m_data[1];
  fVar5 = c->in[1].m_data[2];
  fVar6 = c->in[1].m_data[3];
  uVar11 = (uint)fVar3;
  uVar13 = (uint)fVar4;
  uVar15 = (uint)fVar5;
  uVar17 = (uint)fVar6;
  res_1.m_data[0] = (int)uVar17 >> 0x1f & (int)(fVar6 - 2.1474836e+09) | uVar17;
  res_1.m_data[1] = (int)uVar15 >> 0x1f & (int)(fVar5 - 2.1474836e+09) | uVar15;
  res_1.m_data[2] = (int)uVar13 >> 0x1f & (int)(fVar4 - 2.1474836e+09) | uVar13;
  res_1.m_data[3] = (int)uVar11 >> 0x1f & (int)(fVar3 - 2.1474836e+09) | uVar11;
  lVar8 = 0;
  bVar9 = false;
  do {
    bVar7 = !bVar9;
    bVar9 = true;
    if (bVar7) {
      bVar9 = res.m_data[lVar8] != res_1.m_data[lVar8];
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  (c->color).m_data[0] = (float)bVar9;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }